

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

long Curl_timeleft(SessionHandle *data,timeval *nowp,_Bool duringconnect)

{
  bool bVar1;
  char cVar2;
  __suseconds_t *p_Var3;
  long lVar4;
  long lVar5;
  undefined7 in_register_00000011;
  long lVar6;
  timeval tVar7;
  timeval newer;
  __suseconds_t local_28;
  __time_t local_20;
  
  p_Var3 = &local_28;
  lVar6 = (data->set).timeout;
  bVar1 = 0 < lVar6;
  cVar2 = bVar1;
  if (((int)CONCAT71(in_register_00000011,duringconnect) != 0) &&
     (cVar2 = bVar1 + '\x02', (data->set).connecttimeout < 1)) {
    cVar2 = bVar1;
  }
  if (cVar2 != '\x01') {
    if (cVar2 == '\x03') {
      lVar5 = (data->set).connecttimeout;
      if (lVar5 <= lVar6) {
        lVar6 = lVar5;
      }
    }
    else if (cVar2 == '\x02') {
      lVar6 = (data->set).connecttimeout;
    }
    else {
      lVar6 = 300000;
      if (!duringconnect) {
        return 0;
      }
    }
  }
  if (nowp == (timeval *)0x0) {
    tVar7 = curlx_tvnow();
    nowp = (timeval *)&local_20;
    local_20 = tVar7.tv_sec;
    local_28 = tVar7.tv_usec;
  }
  else {
    p_Var3 = &nowp->tv_usec;
  }
  tVar7.tv_usec = (data->progress).speeder[(ulong)!duringconnect * 2 + -5];
  tVar7.tv_sec = (data->progress).speeder[(ulong)!duringconnect * 2 + -6];
  newer.tv_usec = *p_Var3;
  newer.tv_sec = nowp->tv_sec;
  lVar4 = curlx_tvdiff(newer,tVar7);
  lVar5 = -1;
  if (lVar6 - lVar4 != 0) {
    lVar5 = lVar6 - lVar4;
  }
  return lVar5;
}

Assistant:

long Curl_timeleft(struct SessionHandle *data,
                   struct timeval *nowp,
                   bool duringconnect)
{
  int timeout_set = 0;
  long timeout_ms = duringconnect?DEFAULT_CONNECT_TIMEOUT:0;
  struct timeval now;

  /* if a timeout is set, use the most restrictive one */

  if(data->set.timeout > 0)
    timeout_set |= 1;
  if(duringconnect && (data->set.connecttimeout > 0))
    timeout_set |= 2;

  switch (timeout_set) {
  case 1:
    timeout_ms = data->set.timeout;
    break;
  case 2:
    timeout_ms = data->set.connecttimeout;
    break;
  case 3:
    if(data->set.timeout < data->set.connecttimeout)
      timeout_ms = data->set.timeout;
    else
      timeout_ms = data->set.connecttimeout;
    break;
  default:
    /* use the default */
    if(!duringconnect)
      /* if we're not during connect, there's no default timeout so if we're
         at zero we better just return zero and not make it a negative number
         by the math below */
      return 0;
    break;
  }

  if(!nowp) {
    now = Curl_tvnow();
    nowp = &now;
  }

  /* subtract elapsed time */
  if(duringconnect)
    /* since this most recent connect started */
    timeout_ms -= Curl_tvdiff(*nowp, data->progress.t_startsingle);
  else
    /* since the entire operation started */
    timeout_ms -= Curl_tvdiff(*nowp, data->progress.t_startop);
  if(!timeout_ms)
    /* avoid returning 0 as that means no timeout! */
    return -1;

  return timeout_ms;
}